

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_icc_check_length
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_const_charp name,
              png_uint_32 profile_length)

{
  int iVar1;
  png_uint_32 profile_length_local;
  png_const_charp name_local;
  png_colorspacerp colorspace_local;
  png_const_structrp png_ptr_local;
  
  iVar1 = icc_check_length(png_ptr,colorspace,name,profile_length);
  if (iVar1 == 0) {
    png_ptr_local._4_4_ = 0;
  }
  else if ((png_ptr->user_chunk_malloc_max == 0) ||
          ((ulong)profile_length <= png_ptr->user_chunk_malloc_max)) {
    png_ptr_local._4_4_ = 1;
  }
  else {
    png_ptr_local._4_4_ =
         png_icc_profile_error
                   (png_ptr,colorspace,name,(ulong)profile_length,"exceeds application limits");
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int /* bool */
icc_check_length(png_const_structrp png_ptr, png_colorspacerp colorspace,
    png_const_charp name, png_uint_32 profile_length)
{
   if (profile_length < 132)
      return png_icc_profile_error(png_ptr, colorspace, name, profile_length,
          "too short");
   return 1;
}